

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void bench_get_msurf_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  uint uVar1;
  long lVar2;
  reference __src;
  uint uVar3;
  size_type __n;
  ulong uVar4;
  int j;
  ulong uVar5;
  long lVar6;
  interest_point ipoint;
  
  for (uVar5 = 0; uVar5 < (ulong)(*(long *)(functions + 8) - *(long *)functions >> 3);
      uVar5 = uVar5 + 1) {
    lVar6 = uVar5 * 0x238;
    uVar1 = *(uint *)(*(long *)data + 0x208 + lVar6);
    uVar3 = 5;
    if ((int)uVar1 < 5) {
      uVar3 = uVar1;
    }
    for (__n = 0; (~((int)uVar3 >> 0x1f) & uVar3) != __n; __n = __n + 1) {
      __src = std::vector<interest_point,_std::allocator<interest_point>_>::at(interest_points,__n);
      memcpy(&ipoint,__src,0x114);
      perf_get_msurf_descriptor
                (*(_func_void_integral_image_ptr_interest_point_ptr **)
                  (*(long *)functions + uVar5 * 8),iimage,&ipoint,
                 (benchmark_data *)(*(long *)data + lVar6));
    }
    if (uVar1 != 0) {
      lVar2 = *(long *)data;
      uVar4 = (ulong)(int)uVar3;
      *(ulong *)(lVar2 + 0x218 + lVar6) = *(ulong *)(lVar2 + 0x218 + lVar6) / uVar4;
      *(ulong *)(lVar2 + 0x228 + lVar6) = *(ulong *)(lVar2 + 0x228 + lVar6) / uVar4;
      *(ulong *)(lVar2 + 0x220 + lVar6) = *(ulong *)(lVar2 + 0x220 + lVar6) / uVar4;
      *(double *)(lVar2 + 0x230 + lVar6) = *(double *)(lVar2 + 0x230 + lVar6) / (double)(int)uVar3;
    }
  }
  return;
}

Assistant:

void bench_get_msurf_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_msurf_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_msurf_descriptor(functions[j], iimage, &ipoint, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}